

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall ON_4dRect::SubtractRect(ON_4dRect *this,ON_4dRect *rect1,ON_4dRect *rect2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (rect1 != (ON_4dRect *)0x0) {
    dVar1 = rect1->left;
    dVar2 = rect1->top;
    dVar3 = rect1->bottom;
    this->right = rect1->right;
    this->bottom = dVar3;
    this->left = dVar1;
    this->top = dVar2;
    if ((rect2 != (ON_4dRect *)0x0) &&
       ((dVar1 = rect1->right - rect1->left, dVar1 != 0.0 || (NAN(dVar1))))) {
      dVar1 = rect1->bottom - rect1->top;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar1 = rect2->right;
        dVar2 = rect2->left;
        if ((dVar1 - dVar2 != 0.0) || (NAN(dVar1 - dVar2))) {
          dVar3 = rect2->bottom - rect2->top;
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            if ((rect2->top <= rect1->top) && (rect1->bottom <= rect2->bottom)) {
              dVar3 = this->left;
              if (dVar3 < dVar1) {
                dVar3 = ON_Min(dVar1,this->right);
                this->left = dVar3;
                dVar2 = rect2->left;
              }
              if (dVar2 < this->right) {
                dVar1 = ON_Max(dVar3,dVar2);
                this->right = dVar1;
                dVar2 = rect2->left;
              }
            }
            if ((dVar2 <= rect1->left) && (rect1->right <= rect2->right)) {
              dVar1 = this->top;
              if (dVar1 < rect2->bottom) {
                dVar1 = ON_Min(rect2->bottom,this->bottom);
                this->top = dVar1;
              }
              if (rect2->top < this->bottom) {
                dVar1 = ON_Max(dVar1,rect2->top);
                this->bottom = dVar1;
              }
            }
          }
        }
      }
    }
  }
  return rect1 != (ON_4dRect *)0x0;
}

Assistant:

bool ON_4dRect::SubtractRect(const ON_4dRect* rect1, const ON_4dRect* rect2)
{
	if (rect1 == nullptr)
		return false;

	*this = *rect1;

	if (rect1->IsRectEmpty() || rect2 == nullptr || rect2->IsRectEmpty())
	{
		return true;
	}

	if (rect2->top <= rect1->top && rect2->bottom >= rect1->bottom)
	{
		if (left < rect2->right)
		{
			left = ON_Min(rect2->right, right);
		}
		if (right > rect2->left)
		{
			right = ON_Max(left, rect2->left);
		}
	}

	if (rect2->left <= rect1->left && rect2->right >= rect1->right)
	{
		if (top < rect2->bottom)
		{
			top = ON_Min(rect2->bottom, bottom);
		}
		if (bottom > rect2->top)
		{
			bottom = ON_Max(top, rect2->top);
		}
	}

	return true;
}